

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,int side,int bc,TPZVec<int> *mapside)

{
  TPZGeoMesh *pTVar1;
  uint uVar2;
  MElementType MVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  ulong uVar7;
  TPZGeoElSide me;
  int64_t index;
  TPZManVector<long,_10> nodeindices;
  TPZGeoElSide newelside;
  TPZGeoElSide local_d8;
  undefined1 local_c0 [8];
  TPZManVector<long,_10> local_b8;
  TPZGeoElSide local_48;
  TPZGeoEl *pTVar6;
  
  uVar2 = pztopology::TPZLine::NSideNodes(side);
  TPZManVector<long,_10>::TPZManVector(&local_b8,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      lVar5 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,uVar7 & 0xffffffff);
      local_b8.super_TPZVec<long>.fStore[mapside->fStore[uVar7]] = lVar5;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  pTVar1 = (this->super_TPZGeoEl).fMesh;
  MVar3 = pztopology::TPZLine::Type(side);
  iVar4 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xd])
                    (pTVar1,(ulong)MVar3,&local_b8,(ulong)(uint)bc,local_c0);
  pTVar6 = (TPZGeoEl *)CONCAT44(extraout_var,iVar4);
  local_d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
  local_d8.fGeoEl = &this->super_TPZGeoEl;
  local_d8.fSide = side;
  local_48.fSide = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
  local_48.fSide = local_48.fSide + -1;
  local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
  local_48.fGeoEl = pTVar6;
  TPZGeoElSide::InsertConnectivity(&local_48,&local_d8,mapside);
  (**(code **)(*(long *)pTVar6 + 0x78))(pTVar6);
  TPZManVector<long,_10>::~TPZManVector(&local_b8);
  return pTVar6;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc, const TPZVec<int> &mapside)
{
    int sidennodes = TGeo::NSideNodes(side);
    TPZManVector<int64_t> nodeindices(sidennodes);
    int inode;
    for(inode=0; inode<sidennodes; inode++){
        nodeindices[mapside[inode]] = this->SideNodeIndex(side,inode);
    }
    int64_t index;
    
    TPZGeoMesh *mesh = this->Mesh();
    MElementType BCtype = TGeo::Type(side);
    
    TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
    TPZGeoElSide me(this,side);
    TPZGeoElSide newelside(newel,newel->NSides()-1);
    
    newelside.InsertConnectivity(me,mapside);
    newel->Initialize();
    
    return newel;
}